

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

bool __thiscall cmGraphVizWriter::IgnoreThisTarget(cmGraphVizWriter *this,string *name)

{
  pointer pRVar1;
  bool bVar2;
  RegularExpression *regEx;
  pointer this_00;
  
  for (this_00 = (this->TargetsToIgnoreRegex).
                 super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pRVar1 = (this->TargetsToIgnoreRegex).
               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_finish, this_00 != pRVar1; this_00 = this_00 + 1)
  {
    if (this_00->program != (char *)0x0) {
      bVar2 = cmsys::RegularExpression::find(this_00,name);
      if (bVar2) break;
    }
  }
  return this_00 != pRVar1;
}

Assistant:

bool cmGraphVizWriter::IgnoreThisTarget(const std::string& name)
{
  for (std::vector<cmsys::RegularExpression>::iterator itvIt =
         this->TargetsToIgnoreRegex.begin();
       itvIt != this->TargetsToIgnoreRegex.end(); ++itvIt) {
    cmsys::RegularExpression& regEx = *itvIt;
    if (regEx.is_valid()) {
      if (regEx.find(name)) {
        return true;
      }
    }
  }

  return false;
}